

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cchoose.c
# Opt level: O1

char * cwhen_openTag(FILE *out,char *line)

{
  int iVar1;
  csafestring_t *obj;
  size_t __size;
  char *pcVar2;
  
  obj = modules_extractVariable(line,"test");
  if (obj == (csafestring_t *)0x0) {
    obj = (csafestring_t *)0x0;
  }
  else {
    if (*module_cchoose.data == '\x01') {
      *(undefined1 *)module_cchoose.data = 0;
      pcVar2 = "if ( ";
      __size = 5;
    }
    else {
      pcVar2 = "else if ( ";
      __size = 10;
    }
    fwrite(pcVar2,__size,1,(FILE *)out);
    iVar1 = safe_strncmp(obj,"${",2);
    if (iVar1 == 0) {
      expression_eval(out,obj->data,false);
    }
    else {
      fputs(obj->data,(FILE *)out);
    }
    fwrite(" ) {\n",5,1,(FILE *)out);
  }
  safe_destroy(obj);
  pcVar2 = modules_findEndOfTag(line);
  return pcVar2 + 1;
}

Assistant:

static char *cwhen_openTag(FILE *out, char *line) {
	csafestring_t *test = modules_extractVariable(line, "test");
	bool *data = (bool *) module_cchoose.data;

	if ( test == NULL ) {
		safe_destroy(test);
		return modules_findEndOfTag(line) + 1;
	}

	if ( *data ) {
		*data = false;
		fprintf(out, "if ( ");
	} else {
		fprintf(out, "else if ( ");
	}
	if ( !safe_strncmp(test, "${", 2) ) {
		expression_eval(out, test->data, false);
	} else {
		fprintf(out, "%s", test->data);
	}
	fprintf(out, " ) {\n");

	safe_destroy(test);
	return modules_findEndOfTag(line) + 1;
}